

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O0

int IDASensAllocVectors(IDAMem IDA_mem,N_Vector tmpl)

{
  undefined8 uVar1;
  void *pvVar2;
  undefined8 in_RSI;
  long in_RDI;
  int maxcol;
  int j;
  int local_24;
  int local_1c;
  int local_4;
  
  *(undefined8 *)(in_RDI + 0x3b8) = *(undefined8 *)(in_RDI + 0x2c8);
  *(undefined8 *)(in_RDI + 0x3c0) = *(undefined8 *)(in_RDI + 0x2d0);
  uVar1 = N_VClone(in_RSI);
  *(undefined8 *)(in_RDI + 0x3c8) = uVar1;
  if (*(long *)(in_RDI + 0x3c8) == 0) {
    local_4 = 0;
  }
  else {
    uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
    *(undefined8 *)(in_RDI + 0x380) = uVar1;
    if (*(long *)(in_RDI + 0x380) == 0) {
      N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
      local_4 = 0;
    }
    else {
      uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
      *(undefined8 *)(in_RDI + 0x388) = uVar1;
      if (*(long *)(in_RDI + 0x388) == 0) {
        N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
        N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
        local_4 = 0;
      }
      else {
        uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
        *(undefined8 *)(in_RDI + 0x390) = uVar1;
        if (*(long *)(in_RDI + 0x390) == 0) {
          N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
          N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
          N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
          local_4 = 0;
        }
        else {
          uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
          *(undefined8 *)(in_RDI + 0x398) = uVar1;
          if (*(long *)(in_RDI + 0x398) == 0) {
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
            N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
            N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
            local_4 = 0;
          }
          else {
            uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
            *(undefined8 *)(in_RDI + 0x3a0) = uVar1;
            if (*(long *)(in_RDI + 0x3a0) == 0) {
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
              N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
              N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
              local_4 = 0;
            }
            else {
              uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
              *(undefined8 *)(in_RDI + 0x3a8) = uVar1;
              if (*(long *)(in_RDI + 0x3a8) == 0) {
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x3a0),*(undefined4 *)(in_RDI + 0xa0));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
                N_VDestroyVectorArray
                          (*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
                N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
                local_4 = 0;
              }
              else {
                uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
                *(undefined8 *)(in_RDI + 0x3b0) = uVar1;
                if (*(long *)(in_RDI + 0x3b0) == 0) {
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x3a8),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x3a0),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroyVectorArray
                            (*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
                  N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
                  local_4 = 0;
                }
                else {
                  *(long *)(in_RDI + 0x678) =
                       (long)(*(int *)(in_RDI + 0xa0) * 5 + 1) * *(long *)(in_RDI + 0x658) +
                       *(long *)(in_RDI + 0x678);
                  *(long *)(in_RDI + 0x680) =
                       (long)(*(int *)(in_RDI + 0xa0) * 5 + 1) * *(long *)(in_RDI + 0x660) +
                       *(long *)(in_RDI + 0x680);
                  if (*(int *)(in_RDI + 0x560) < 5) {
                    local_24 = 4;
                  }
                  else {
                    local_24 = *(int *)(in_RDI + 0x560);
                  }
                  for (local_1c = 0; local_1c <= local_24; local_1c = local_1c + 1) {
                    uVar1 = N_VCloneVectorArray(*(undefined4 *)(in_RDI + 0xa0),in_RSI);
                    *(undefined8 *)(in_RDI + 0x350 + (long)local_1c * 8) = uVar1;
                    if (*(long *)(in_RDI + 0x350 + (long)local_1c * 8) == 0) {
                      N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3a0),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3a8),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3b0),*(undefined4 *)(in_RDI + 0xa0));
                      return 0;
                    }
                  }
                  *(long *)(in_RDI + 0x678) =
                       (long)(local_24 * *(int *)(in_RDI + 0xa0)) * *(long *)(in_RDI + 0x658) +
                       *(long *)(in_RDI + 0x678);
                  *(long *)(in_RDI + 0x680) =
                       (long)(local_24 * *(int *)(in_RDI + 0xa0)) * *(long *)(in_RDI + 0x660) +
                       *(long *)(in_RDI + 0x680);
                  *(undefined8 *)(in_RDI + 200) = 0;
                  pvVar2 = malloc((long)*(int *)(in_RDI + 0xa0) << 3);
                  *(void **)(in_RDI + 200) = pvVar2;
                  if (*(long *)(in_RDI + 200) == 0) {
                    N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x3a0),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x3a8),*(undefined4 *)(in_RDI + 0xa0));
                    N_VDestroyVectorArray
                              (*(undefined8 *)(in_RDI + 0x3b0),*(undefined4 *)(in_RDI + 0xa0));
                    for (local_1c = 0; local_1c <= local_24; local_1c = local_1c + 1) {
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x350 + (long)local_1c * 8),
                                 *(undefined4 *)(in_RDI + 0xa0));
                    }
                    local_4 = 0;
                  }
                  else {
                    *(undefined8 *)(in_RDI + 0xd0) = 0;
                    pvVar2 = malloc((long)*(int *)(in_RDI + 0xa0) << 2);
                    *(void **)(in_RDI + 0xd0) = pvVar2;
                    if (*(long *)(in_RDI + 0xd0) == 0) {
                      N_VDestroy(*(undefined8 *)(in_RDI + 0x3c8));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x380),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x388),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x390),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x398),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3a0),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3a8),*(undefined4 *)(in_RDI + 0xa0));
                      N_VDestroyVectorArray
                                (*(undefined8 *)(in_RDI + 0x3b0),*(undefined4 *)(in_RDI + 0xa0));
                      for (local_1c = 0; local_1c <= local_24; local_1c = local_1c + 1) {
                        N_VDestroyVectorArray
                                  (*(undefined8 *)(in_RDI + 0x350 + (long)local_1c * 8),
                                   *(undefined4 *)(in_RDI + 0xa0));
                      }
                      free(*(void **)(in_RDI + 200));
                      *(undefined8 *)(in_RDI + 200) = 0;
                      local_4 = 0;
                    }
                    else {
                      *(long *)(in_RDI + 0x678) =
                           (long)*(int *)(in_RDI + 0xa0) + *(long *)(in_RDI + 0x678);
                      *(long *)(in_RDI + 0x680) =
                           (long)*(int *)(in_RDI + 0xa0) + *(long *)(in_RDI + 0x680);
                      local_4 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static sunbooleantype IDASensAllocVectors(IDAMem IDA_mem, N_Vector tmpl)
{
  int j, maxcol;

  IDA_mem->ida_tmpS1 = IDA_mem->ida_tempv1;
  IDA_mem->ida_tmpS2 = IDA_mem->ida_tempv2;

  /* Allocate space for workspace vectors */

  IDA_mem->ida_tmpS3 = N_VClone(tmpl);
  if (IDA_mem->ida_tmpS3 == NULL) { return (SUNFALSE); }

  IDA_mem->ida_ewtS = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_ewtS == NULL)
  {
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  IDA_mem->ida_eeS = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_eeS == NULL)
  {
    N_VDestroy(IDA_mem->ida_tmpS3);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    return (SUNFALSE);
  }

  IDA_mem->ida_yyS = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_yyS == NULL)
  {
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  IDA_mem->ida_ypS = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_ypS == NULL)
  {
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  IDA_mem->ida_yySpredict = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_yySpredict == NULL)
  {
    N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  IDA_mem->ida_ypSpredict = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_ypSpredict == NULL)
  {
    N_VDestroyVectorArray(IDA_mem->ida_yySpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  IDA_mem->ida_deltaS = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
  if (IDA_mem->ida_deltaS == NULL)
  {
    N_VDestroyVectorArray(IDA_mem->ida_ypSpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yySpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroy(IDA_mem->ida_tmpS3);
    return (SUNFALSE);
  }

  /* Update solver workspace lengths */
  IDA_mem->ida_lrw += (5 * IDA_mem->ida_Ns + 1) * IDA_mem->ida_lrw1;
  IDA_mem->ida_liw += (5 * IDA_mem->ida_Ns + 1) * IDA_mem->ida_liw1;

  /* Allocate space for phiS */
  /*  Make sure phiS[2], phiS[3] and phiS[4] are
      allocated (for use as temporary vectors), regardless of maxord.*/

  maxcol = SUNMAX(IDA_mem->ida_maxord, 4);
  for (j = 0; j <= maxcol; j++)
  {
    IDA_mem->ida_phiS[j] = N_VCloneVectorArray(IDA_mem->ida_Ns, tmpl);
    if (IDA_mem->ida_phiS[j] == NULL)
    {
      N_VDestroy(IDA_mem->ida_tmpS3);
      N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_yySpredict, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_ypSpredict, IDA_mem->ida_Ns);
      N_VDestroyVectorArray(IDA_mem->ida_deltaS, IDA_mem->ida_Ns);
      return (SUNFALSE);
    }
  }

  /* Update solver workspace lengths */
  IDA_mem->ida_lrw += maxcol * IDA_mem->ida_Ns * IDA_mem->ida_lrw1;
  IDA_mem->ida_liw += maxcol * IDA_mem->ida_Ns * IDA_mem->ida_liw1;

  /* Allocate space for pbar and plist */

  IDA_mem->ida_pbar = NULL;
  IDA_mem->ida_pbar = (sunrealtype*)malloc(IDA_mem->ida_Ns * sizeof(sunrealtype));
  if (IDA_mem->ida_pbar == NULL)
  {
    N_VDestroy(IDA_mem->ida_tmpS3);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yySpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypSpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_deltaS, IDA_mem->ida_Ns);
    for (j = 0; j <= maxcol; j++)
    {
      N_VDestroyVectorArray(IDA_mem->ida_phiS[j], IDA_mem->ida_Ns);
    }
    return (SUNFALSE);
  }

  IDA_mem->ida_plist = NULL;
  IDA_mem->ida_plist = (int*)malloc(IDA_mem->ida_Ns * sizeof(int));
  if (IDA_mem->ida_plist == NULL)
  {
    N_VDestroy(IDA_mem->ida_tmpS3);
    N_VDestroyVectorArray(IDA_mem->ida_ewtS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_eeS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yyS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypS, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_yySpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_ypSpredict, IDA_mem->ida_Ns);
    N_VDestroyVectorArray(IDA_mem->ida_deltaS, IDA_mem->ida_Ns);
    for (j = 0; j <= maxcol; j++)
    {
      N_VDestroyVectorArray(IDA_mem->ida_phiS[j], IDA_mem->ida_Ns);
    }
    free(IDA_mem->ida_pbar);
    IDA_mem->ida_pbar = NULL;
    return (SUNFALSE);
  }

  /* Update solver workspace lengths */
  IDA_mem->ida_lrw += IDA_mem->ida_Ns;
  IDA_mem->ida_liw += IDA_mem->ida_Ns;

  return (SUNTRUE);
}